

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O0

int __thiscall TPZCheckMesh::CheckConnectOrderConsistency(TPZCheckMesh *this)

{
  uchar uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_00;
  int64_t iVar5;
  iterator iVar6;
  pointer ppVar7;
  TPZCompEl **ppTVar8;
  TPZConnect *this_01;
  ostream *this_02;
  int iVar9;
  undefined8 *in_RDI;
  int nshape;
  TPZConnect *c;
  int ic;
  int nc;
  TPZInterpolatedElement *intel;
  TPZCompEl *cel;
  int iel;
  int nstate;
  int nel;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *in_stack_ffffffffffffff88;
  long *plVar10;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  long *local_68;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_40;
  TPZCompEl *pTVar11;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar12;
  
  this_00 = TPZCompMesh::ElementVec((TPZCompMesh *)*in_RDI);
  iVar5 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                    (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>);
  iVar9 = (int)iVar5;
  TPZCompMesh::MaterialVec((TPZCompMesh *)*in_RDI);
  iVar6 = std::
          map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
          ::begin(in_stack_ffffffffffffff88);
  ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  uVar2 = (**(code **)(*(long *)ppVar7->second + 0x78))();
  iVar12 = 0;
  do {
    if (iVar9 <= iVar12) {
      return -1;
    }
    TPZCompMesh::ElementVec((TPZCompMesh *)*in_RDI);
    ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         (int64_t)in_RDI);
    pTVar11 = *ppTVar8;
    if (pTVar11 != (TPZCompEl *)0x0) {
      if (pTVar11 == (TPZCompEl *)0x0) {
        local_68 = (long *)0x0;
      }
      else {
        local_68 = (long *)__dynamic_cast(pTVar11,&TPZCompEl::typeinfo,
                                          &TPZInterpolatedElement::typeinfo,0);
      }
      iVar3 = (**(code **)(*local_68 + 0x380))();
      if (iVar3 == 0) {
        (**(code **)(*local_68 + 200))(local_68,&std::cout);
        return iVar12;
      }
      iVar3 = (**(code **)(*local_68 + 0x90))();
      for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
        this_01 = (TPZConnect *)(**(code **)(*local_68 + 0xa8))(local_68,local_40);
        plVar10 = local_68;
        iVar4 = local_40;
        uVar1 = TPZConnect::Order(this_01);
        in_stack_ffffffffffffffb4 = (**(code **)(*plVar10 + 0x260))(plVar10,iVar4,uVar1);
        iVar4 = TPZConnect::CheckDependency
                          ((TPZConnect *)CONCAT44(iVar9,uVar2),(int)((ulong)iVar6._M_node >> 0x20),
                           (TPZCompMesh *)CONCAT44(iVar12,in_stack_ffffffffffffffd8),
                           (int)((ulong)pTVar11 >> 0x20));
        if (iVar4 == -1) {
          this_02 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh inconsistent dependency");
          std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
          (**(code **)(*local_68 + 200))(local_68,&std::cout);
          return iVar12;
        }
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

int TPZCheckMesh::CheckConnectOrderConsistency() {
	
	int nel = fMesh->ElementVec().NElements();
	int nstate = (fMesh->MaterialVec().begin()->second)->NStateVariables();
	int iel;
	for(iel = 0; iel<nel; iel++) {
		TPZCompEl *cel = fMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
		if(!intel->CheckElementConsistency()) {
			intel->Print();
			return iel;
		}
		int nc = intel->NConnects();
		int ic;
		for(ic = 0; ic<nc; ic++) {
			TPZConnect &c = intel->Connect(ic);
			int nshape = intel->NConnectShapeF(ic,c.Order());
			if(c.CheckDependency(nshape, fMesh, nstate) == -1) {
				cout << "TPZCheckMesh inconsistent dependency" << endl;
				intel->Print();
				return iel;
			}
		}
	}
	return -1;
}